

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O0

void nh_session_handler(nh_session_t *session)

{
  nh_session_t *session_local;
  
  if (session->state == SESSION_READ) {
    nh_session_read(session);
  }
  else if (session->state == SESSION_WRITE) {
    nh_session_write(session);
  }
  if ((session->flags & 4) == 0) {
    if (session->state == SESSION_END) {
      nh_session_free(session);
    }
  }
  else {
    nh_context_clear(&session->context);
    free(session);
  }
  return;
}

Assistant:

void nh_session_handler(nh_session_t *session) {
    switch (session->state) {
        case SESSION_READ:
            nh_session_read(session);
            break;
        case SESSION_WRITE:
            nh_session_write(session);
            break;
        case SESSION_END:
            break;
    }

#ifndef DISABLE_WEBSOCKET
    if (FLAG_CHECK(session->flags, SESSION_FLAG_UPGRADED)) {
        // events will be handled by other protocols so just free session and http context
        nh_context_clear(&session->context);
        free(session);
        return;
    }
#endif

    if (session->state == SESSION_END) nh_session_free(session);
}